

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

bool __thiscall
libcellml::Variable::VariableImpl::setEquivalentTo
          (VariableImpl *this,VariablePtr *equivalentVariable)

{
  bool bVar1;
  undefined1 local_30 [8];
  VariableWeakPtr weakEquivalentVariable;
  VariablePtr *equivalentVariable_local;
  VariableImpl *this_local;
  
  weakEquivalentVariable.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)equivalentVariable;
  cleanExpiredVariables(this);
  bVar1 = hasEquivalentVariable
                    (this,(VariablePtr *)
                          weakEquivalentVariable.
                          super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi,false);
  if (!bVar1) {
    std::weak_ptr<libcellml::Variable>::weak_ptr<libcellml::Variable,void>
              ((weak_ptr<libcellml::Variable> *)local_30,
               (shared_ptr<libcellml::Variable> *)
               weakEquivalentVariable.
               super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    std::
    vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
    ::push_back(&this->mEquivalentVariables,(weak_ptr<libcellml::Variable> *)local_30);
    std::weak_ptr<libcellml::Variable>::~weak_ptr((weak_ptr<libcellml::Variable> *)local_30);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool Variable::VariableImpl::setEquivalentTo(const VariablePtr &equivalentVariable)
{
    cleanExpiredVariables();
    if (!hasEquivalentVariable(equivalentVariable)) {
        VariableWeakPtr weakEquivalentVariable = equivalentVariable;
        mEquivalentVariables.push_back(weakEquivalentVariable);
        return true;
    }

    return false;
}